

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationContainer.cpp
# Opt level: O0

void __thiscall UtilizationContainer::updateLegend(UtilizationContainer *this)

{
  int iVar1;
  QLabel *pQVar2;
  QString local_c0;
  QString local_a8;
  FindChildOptions local_8c;
  QString local_88;
  QString local_70;
  QString local_58;
  FindChildOptions local_2c;
  QString local_28;
  UtilizationContainer *local_10;
  UtilizationContainer *this_local;
  
  local_10 = this;
  QString::QString(&local_28,"graphStep");
  QFlags<Qt::FindChildOption>::QFlags(&local_2c,FindChildrenRecursively);
  pQVar2 = QObject::findChild<QLabel*>((QObject *)this,&local_28,local_2c);
  iVar1 = SettingsManager::getUpdateDelay();
  QString::number((double)((float)iVar1 / 1000.0),(char)&local_70,0x67);
  operator+(&local_58,&local_70," sec step");
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_58);
  QString::~QString(&local_70);
  QString::~QString(&local_28);
  QString::QString(&local_88,"graphTime");
  QFlags<Qt::FindChildOption>::QFlags(&local_8c,FindChildrenRecursively);
  pQVar2 = QObject::findChild<QLabel*>((QObject *)this,&local_88,local_8c);
  iVar1 = SettingsManager::getGraphLength();
  QString::number((double)((float)iVar1 / 1000.0),(char)&local_c0,0x67);
  operator+(&local_a8,&local_c0," sec");
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_a8);
  QString::~QString(&local_c0);
  QString::~QString(&local_88);
  onLegendUpdate(this);
  return;
}

Assistant:

void UtilizationContainer::updateLegend() {
    findChild<QLabel*>(graphStepName)->setText(QString::number(SettingsManager::getUpdateDelay() / 1000.0f) + " sec step");
    findChild<QLabel*>(graphTimeName)->setText(QString::number(SettingsManager::getGraphLength() / 1000.0f) + " sec");
    emit onLegendUpdate();
}